

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O2

void placalc::LoadItemToAmplification(void)

{
  FILE *__stream;
  size_t sVar1;
  uint uVar2;
  item_amplification ia;
  int opts;
  
  __stream = fopen("input/amplifications.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","LoadItemToAmplification",
            "input/amplifications.bin");
  }
  else {
    fread(&opts,4,1,__stream);
    sVar1 = fread(&ia,8,1,__stream);
    uVar2 = 1;
    while( true ) {
      if (sVar1 == 0) {
        fclose(__stream);
        return;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&item_to_amplification_,&ia.amplification_id);
      if (uVar2 != ia.item_id) break;
      uVar2 = uVar2 + 1;
      sVar1 = fread(&ia,8,1,__stream);
    }
    fprintf(_stderr,
            "FATAL: %s: Item IDs are not contiguous. Expected item ID %d but read item ID %d\n",
            "LoadItemToAmplification",(ulong)uVar2);
  }
  exit(1);
}

Assistant:

void LoadItemToAmplification() {

    FILE * fin = fopen(AMPLIFICATION_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__,
	      AMPLIFICATION_FILE);
      exit(EXIT_FAILURE);
    }

    int opts;
    size_t i = fread(&opts, sizeof(opts), 1, fin);

    item_amplification ia;
    int expectedItemID = 1;
    i = fread(&ia, sizeof(ia), 1, fin);
    while (i != 0) {
      item_to_amplification_.push_back(ia.amplification_id);
      if (ia.item_id != expectedItemID) {
	fprintf(stderr, "FATAL: %s: Item IDs are not contiguous. "
			"Expected item ID %d but read item ID %d\n",
		__func__, expectedItemID, ia.item_id);
	exit(EXIT_FAILURE);
      }
      ++expectedItemID;
      i = fread(&ia, sizeof(ia), 1, fin);
    }

    fclose(fin);

  }